

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O2

void __thiscall PcodeOp::insertInput(PcodeOp *this,int4 slot)

{
  vector<Varnode_*,_std::allocator<Varnode_*>_> *this_00;
  pointer ppVVar1;
  int iVar2;
  long lVar3;
  Varnode *local_20;
  
  this_00 = &this->inrefs;
  local_20 = (Varnode *)0x0;
  std::vector<Varnode*,std::allocator<Varnode*>>::emplace_back<Varnode*>
            ((vector<Varnode*,std::allocator<Varnode*>> *)this_00,&local_20);
  iVar2 = (int)((ulong)((long)(this->inrefs).
                              super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->inrefs).
                             super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3);
  lVar3 = (long)(iVar2 + -1) << 3;
  for (iVar2 = iVar2 + -2; slot < iVar2 + 1; iVar2 = iVar2 + -1) {
    ppVVar1 = (this_00->super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    *(Varnode **)((long)ppVVar1 + lVar3) = ppVVar1[iVar2];
    lVar3 = lVar3 + -8;
  }
  (this_00->super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>)._M_impl.
  super__Vector_impl_data._M_start[slot] = (Varnode *)0x0;
  return;
}

Assistant:

void PcodeOp::insertInput(int4 slot)

{
  inrefs.push_back((Varnode *)0);
  for(int4 i=inrefs.size()-1;i>slot;--i)
    inrefs[i] = inrefs[i-1];
  inrefs[slot] = (Varnode *)0;
}